

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O1

size_t wabt::ReadS64Leb128(uint8_t *p,uint8_t *end,uint64_t *out_value)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  
  if ((p < end) && (-1 < (long)(char)*p)) {
    uVar4 = ((long)(char)*p << 0x39) >> 0x39;
    sVar2 = 1;
  }
  else if ((p + 1 < end) && (lVar3 = (long)(char)p[1], -1 < lVar3)) {
    uVar4 = (long)((ulong)(*p & 0x7f) << 0x32 | lVar3 << 0x39) >> 0x32;
    sVar2 = 2;
  }
  else if ((p + 2 < end) && (lVar3 = (long)(char)p[2], -1 < lVar3)) {
    uVar4 = (long)((ulong)(*p & 0x7f) << 0x2b | (ulong)(p[1] & 0x7f) << 0x32 | lVar3 << 0x39) >>
            0x2b;
    sVar2 = 3;
  }
  else if ((p + 3 < end) && (lVar3 = (long)(char)p[3], -1 < lVar3)) {
    uVar4 = (long)((ulong)(*p & 0x7f) << 0x24 | (ulong)(p[1] & 0x7f) << 0x2b |
                   (ulong)(p[2] & 0x7f) << 0x32 | lVar3 << 0x39) >> 0x24;
    sVar2 = 4;
  }
  else if ((p + 4 < end) && (lVar3 = (long)(char)p[4], -1 < lVar3)) {
    uVar4 = (long)((ulong)(*p & 0x7f) << 0x1d | (ulong)(p[1] & 0x7f) << 0x24 |
                   (ulong)(p[2] & 0x7f) << 0x2b | (ulong)(p[3] & 0x7f) << 0x32 | lVar3 << 0x39) >>
            0x1d;
    sVar2 = 5;
  }
  else if ((p + 5 < end) && (lVar3 = (long)(char)p[5], -1 < lVar3)) {
    uVar4 = (long)((ulong)((*p & 0x7f) << 0x16) | (ulong)(p[1] & 0x7f) << 0x1d |
                   (ulong)(p[2] & 0x7f) << 0x24 | (ulong)(p[3] & 0x7f) << 0x2b |
                   (ulong)(p[4] & 0x7f) << 0x32 | lVar3 << 0x39) >> 0x16;
    sVar2 = 6;
  }
  else if ((p + 6 < end) && (lVar3 = (long)(char)p[6], -1 < lVar3)) {
    uVar4 = (long)((ulong)((*p & 0x7f) << 0xf | (p[1] & 0x7f) << 0x16) |
                   (ulong)(p[2] & 0x7f) << 0x1d | (ulong)(p[3] & 0x7f) << 0x24 |
                   (ulong)(p[4] & 0x7f) << 0x2b | (ulong)(p[5] & 0x7f) << 0x32 | lVar3 << 0x39) >>
            0xf;
    sVar2 = 7;
  }
  else if ((p + 7 < end) && (lVar3 = (long)(char)p[7], -1 < lVar3)) {
    uVar4 = (long)((ulong)((*p & 0x7f) << 8 | (p[1] & 0x7f) << 0xf | (p[2] & 0x7f) << 0x16) |
                   (ulong)(p[3] & 0x7f) << 0x1d | (ulong)(p[4] & 0x7f) << 0x24 |
                   (ulong)(p[5] & 0x7f) << 0x2b | (ulong)(p[6] & 0x7f) << 0x32 | lVar3 << 0x39) >> 8
    ;
    sVar2 = 8;
  }
  else {
    if ((end <= p + 8) || (lVar3 = (long)(char)p[8], lVar3 < 0)) {
      if (p + 9 < end) {
        uVar1 = (uint)(char)p[9];
        if ((-1 < (int)uVar1) && ((uVar1 & 0x7e) == (-(uVar1 & 1) & 0x7e))) {
          uVar4 = (ulong)(*p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe |
                         (p[3] & 0x7f) << 0x15) | (ulong)(p[4] & 0x7f) << 0x1c |
                  (ulong)(p[5] & 0x7f) << 0x23 |
                  (ulong)(p[6] & 0x7f) << 0x2a |
                  (ulong)(p[7] & 0x7f) << 0x31 | (ulong)(p[8] & 0x7f) << 0x38 | (ulong)uVar1 << 0x3f
          ;
          sVar2 = 10;
          goto LAB_0012aeb1;
        }
      }
      return 0;
    }
    uVar4 = (long)((ulong)(byte)(*p * '\x02') | (ulong)((p[1] & 0x7f) << 8) |
                   (ulong)((p[2] & 0x7f) << 0xf) | (ulong)((p[3] & 0x7f) << 0x16) |
                   (ulong)(p[4] & 0x7f) << 0x1d | (ulong)(p[5] & 0x7f) << 0x24 |
                  (ulong)(p[6] & 0x7f) << 0x2b | (ulong)(p[7] & 0x7f) << 0x32 | lVar3 << 0x39) >> 1;
    sVar2 = 9;
  }
LAB_0012aeb1:
  *out_value = uVar4;
  return sVar2;
}

Assistant:

size_t ReadS64Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint64_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    uint64_t result = LEB128_1(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 6);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    uint64_t result = LEB128_2(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 13);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    uint64_t result = LEB128_3(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 20);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    uint64_t result = LEB128_4(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 27);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    uint64_t result = LEB128_5(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 34);
    return 5;
  } else if (p + 5 < end && (p[5] & 0x80) == 0) {
    uint64_t result = LEB128_6(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 41);
    return 6;
  } else if (p + 6 < end && (p[6] & 0x80) == 0) {
    uint64_t result = LEB128_7(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 48);
    return 7;
  } else if (p + 7 < end && (p[7] & 0x80) == 0) {
    uint64_t result = LEB128_8(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 55);
    return 8;
  } else if (p + 8 < end && (p[8] & 0x80) == 0) {
    uint64_t result = LEB128_9(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 62);
    return 9;
  } else if (p + 9 < end && (p[9] & 0x80) == 0) {
    // The top bits should be a sign-extension of the sign bit.
    bool sign_bit_set = (p[9] & 0x1);
    int top_bits = p[9] & 0xfe;
    if ((sign_bit_set && top_bits != 0x7e) ||
        (!sign_bit_set && top_bits != 0)) {
      return 0;
    }
    uint64_t result = LEB128_10(uint64_t);
    *out_value = result;
    return 10;
  } else {
    // Past the end.
    return 0;
  }
}